

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void anon_unknown.dwarf_1250c1::writeDString(uint8_t *buffer,char *value,size_t fieldLen)

{
  ulong uVar1;
  char cVar2;
  ushort uVar3;
  convertUTF cVar4;
  undefined2 uVar5;
  pointer puVar6;
  const_iterator it;
  byte *pbVar7;
  byte bVar8;
  uchar uVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> content;
  undefined2 local_8e;
  undefined2 local_8c;
  uchar local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  allocator<char> local_61;
  byte *local_60;
  long local_58;
  long local_50 [2];
  uint8_t *local_40;
  size_t local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,value,&local_61);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  if (local_58 == 0) goto LAB_0018d98d;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_88,fieldLen);
  uVar1 = fieldLen - 1;
  pbVar7 = local_60;
  do {
    local_40 = buffer;
    local_38 = fieldLen;
    if (pbVar7 == local_60 + local_58) {
      local_8e = CONCAT11(local_8e._1_1_,8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_88,(uchar *)&local_8e);
      pbVar7 = local_60;
      goto LAB_0018d8c4;
    }
    bVar11 = *pbVar7;
    uVar13 = (uint)bVar11;
    bVar8 = convertUTF::trailingBytesForUTF8[bVar11];
    iVar12 = 0;
    switch(bVar8) {
    case 0:
      uVar13 = (uint)bVar8;
      break;
    case 5:
      iVar12 = (uint)bVar11 << 6;
      uVar13 = (uint)pbVar7[1];
      pbVar7 = pbVar7 + 1;
    case 4:
      iVar12 = (uVar13 + iVar12) * 0x40;
      uVar13 = (uint)pbVar7[1];
      pbVar7 = pbVar7 + 1;
    case 3:
      iVar12 = (uVar13 + iVar12) * 0x40;
      uVar13 = (uint)pbVar7[1];
      pbVar7 = pbVar7 + 1;
    case 2:
      iVar12 = (uVar13 + iVar12) * 0x40;
      uVar13 = (uint)pbVar7[1];
      pbVar7 = pbVar7 + 1;
    case 1:
      uVar13 = (uVar13 + iVar12) * 0x40;
      bVar11 = pbVar7[1];
      pbVar7 = pbVar7 + 1;
      break;
    default:
      goto switchD_0018d674_default;
    }
    pbVar7 = pbVar7 + 1;
    iVar12 = bVar11 + uVar13;
switchD_0018d674_default:
  } while ((uint)(iVar12 - *(int *)(convertUTF::offsetsFromUTF8 +
                                   (ulong)(ushort)(short)(char)bVar8 * 4)) < 0x100);
  local_8e = CONCAT11(local_8e._1_1_,0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_88,(uchar *)&local_8e);
  if (local_58 != 0) {
    pbVar7 = local_60;
    do {
      bVar11 = *pbVar7;
      uVar13 = (uint)bVar11;
      bVar8 = convertUTF::trailingBytesForUTF8[bVar11];
      iVar12 = 0;
      switch(bVar8) {
      case 0:
        uVar13 = (uint)bVar8;
        break;
      case 5:
        iVar12 = (uint)bVar11 << 6;
        uVar13 = (uint)pbVar7[1];
        pbVar7 = pbVar7 + 1;
      case 4:
        iVar12 = (uVar13 + iVar12) * 0x40;
        uVar13 = (uint)pbVar7[1];
        pbVar7 = pbVar7 + 1;
      case 3:
        iVar12 = (uVar13 + iVar12) * 0x40;
        uVar13 = (uint)pbVar7[1];
        pbVar7 = pbVar7 + 1;
      case 2:
        iVar12 = (uVar13 + iVar12) * 0x40;
        uVar13 = (uint)pbVar7[1];
        pbVar7 = pbVar7 + 1;
      case 1:
        uVar13 = (uVar13 + iVar12) * 0x40;
        bVar11 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
        break;
      default:
        goto switchD_0018d74b_default;
      }
      pbVar7 = pbVar7 + 1;
      iVar12 = bVar11 + uVar13;
switchD_0018d74b_default:
      convertUTF::ConvertUTF32toUTF16
                ((convertUTF *)&local_8e,
                 iVar12 - *(int *)(convertUTF::offsetsFromUTF8 +
                                  (ulong)(ushort)(short)(char)bVar8 * 4));
      uVar5 = local_8c;
      uVar3 = local_8e;
      if ((local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start +
           (uVar1 - (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish) < (uchar *)0x2) ||
         ((local_8e != 0 &&
          (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start +
           (uVar1 - (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish) < (uchar *)0x4)))) break;
      cVar4 = local_8e._1_1_;
      local_8e._0_1_ = SUB21((ushort)local_8c >> 8,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_88,(uchar *)&local_8e);
      local_8e = CONCAT11(local_8e._1_1_,(char)uVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_88,(uchar *)&local_8e);
      if (uVar3 != 0) {
        local_8e._0_1_ = cVar4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&local_88,(uchar *)&local_8e);
        local_8e = CONCAT11(local_8e._1_1_,(char)uVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&local_88,(uchar *)&local_8e);
      }
    } while (pbVar7 != local_60 + local_58);
  }
  goto LAB_0018d846;
LAB_0018d8c4:
  do {
    if (pbVar7 == local_60 + local_58) break;
    bVar8 = *pbVar7;
    cVar2 = convertUTF::trailingBytesForUTF8[bVar8];
    switch(cVar2) {
    case '\0':
      cVar10 = cVar2;
      break;
    case '\x05':
      pbVar7 = pbVar7 + 1;
    case '\x04':
      pbVar7 = pbVar7 + 1;
    case '\x03':
      pbVar7 = pbVar7 + 1;
    case '\x02':
      bVar8 = pbVar7[1];
      pbVar7 = pbVar7 + 1;
    case '\x01':
      cVar10 = bVar8 << 6;
      bVar8 = pbVar7[1];
      pbVar7 = pbVar7 + 1;
      break;
    default:
      cVar10 = '\0';
      goto LAB_0018d91f;
    }
    pbVar7 = pbVar7 + 1;
    cVar10 = bVar8 + cVar10;
LAB_0018d91f:
    uVar9 = cVar10 - (char)*(undefined4 *)
                            (convertUTF::offsetsFromUTF8 + (ulong)(ushort)(short)cVar2 * 4);
    local_8e = CONCAT11(local_8e._1_1_,uVar9);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uchar *)&local_8e);
    }
    else {
      *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar9;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  } while ((ulong)((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) < uVar1);
LAB_0018d846:
  uVar9 = (uchar)((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  lVar14 = uVar1 - ((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  local_89 = uVar9;
  if (lVar14 != 0) {
    do {
      local_8e = local_8e & 0xff00;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_88,(uchar *)&local_8e);
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_89);
    fieldLen = local_38;
    buffer = local_40;
  }
  else {
    *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = uVar9;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    fieldLen = local_38;
    buffer = local_40;
  }
LAB_0018d98d:
  if (local_60 != (byte *)local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  puVar6 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != fieldLen) {
    __assert_fail("content.size() == fieldLen",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                  ,0xb6,
                  "void (anonymous namespace)::writeDString(uint8_t *, const char *, const size_t)")
    ;
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    memmove(buffer,local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,fieldLen);
  }
  if (puVar6 != (uchar *)0x0) {
    operator_delete(puVar6,(long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  return;
}

Assistant:

void writeDString(uint8_t *buffer, const char *value, const size_t fieldLen)
{
    auto content = serializeDString(value, fieldLen);
    assert(content.size() == fieldLen);
    std::copy(std::begin(content), std::end(content), buffer);
}